

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O2

ASN1_OCTET_STRING * a2i_IPADDRESS(char *ipasc)

{
  int iVar1;
  ASN1_OCTET_STRING *str;
  uchar ipout [16];
  uint8_t auStack_28 [24];
  
  iVar1 = x509v3_a2i_ipadd(auStack_28,ipasc);
  if ((iVar1 != 0) && (str = ASN1_OCTET_STRING_new(), str != (ASN1_OCTET_STRING *)0x0)) {
    iVar1 = ASN1_OCTET_STRING_set(str,auStack_28,iVar1);
    if (iVar1 != 0) {
      return str;
    }
    ASN1_OCTET_STRING_free(str);
  }
  return (ASN1_OCTET_STRING *)0x0;
}

Assistant:

ASN1_OCTET_STRING *a2i_IPADDRESS(const char *ipasc) {
  unsigned char ipout[16];
  ASN1_OCTET_STRING *ret;
  int iplen;

  iplen = x509v3_a2i_ipadd(ipout, ipasc);
  if (!iplen) {
    return NULL;
  }

  ret = ASN1_OCTET_STRING_new();
  if (!ret) {
    return NULL;
  }
  if (!ASN1_OCTET_STRING_set(ret, ipout, iplen)) {
    ASN1_OCTET_STRING_free(ret);
    return NULL;
  }
  return ret;
}